

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecPrintStats(Sfm_Dec_t *p)

{
  int iVar1;
  abctime aVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar6 = 0;
  printf("Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n"
         ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesChanged,
         (ulong)(uint)p->nNodesConst0,(ulong)(uint)p->nNodesConst1,(ulong)(uint)p->nNodesBuf,
         (ulong)(uint)p->nNodesInv,(ulong)(uint)p->nNodesResyn,(ulong)(uint)p->nNodesAndOr,
         (ulong)(uint)p->nEfforts,(ulong)(uint)p->nNoDecs);
  uVar5 = (ulong)(uint)p->nNodesTried;
  if (p->nNodesTried < 2) {
    uVar5 = 1;
  }
  iVar4 = 0x719168;
  printf("MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n"
         ,(ulong)(uint)p->nMaxDivs,(ulong)(uint)p->nMaxWin,p->nAllDivs / uVar5 & 0xffffffff,
         p->nAllWin / uVar5 & 0xffffffff,(ulong)(uint)p->nSatCalls,(ulong)(uint)p->nSatCallsSat,
         (ulong)(uint)p->nSatCallsUnsat,(ulong)(uint)p->nSatCallsOver,(ulong)(uint)p->nTimeOuts);
  aVar2 = Abc_Clock();
  lVar3 = aVar2 - p->timeStart;
  p->timeTotal = lVar3;
  p->timeOther = lVar3 - (p->timeLib + p->timeWin + p->timeCnf + p->timeSat + p->timeTime);
  Abc_Print(iVar4,"%s =","Lib   ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeLib * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeLib / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Win   ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Cnf   ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Sat   ");
  dVar8 = (double)(p->timeSat - p->timeEval);
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = (dVar8 * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar8 / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s ="," Sat  ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s ="," Unsat");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Eval  ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeEval / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Timing");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","Other ");
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar7);
  Abc_Print(iVar4,"%s =","ALL   ");
  dVar8 = (double)p->timeTotal;
  dVar7 = 0.0;
  if (p->timeTotal != 0) {
    dVar7 = (dVar8 * 100.0) / dVar8;
  }
  Abc_Print(iVar4,"%9.2f sec (%6.2f %%)\n",dVar8 / 1000000.0,dVar7);
  printf("Cone sizes:  ");
  for (; uVar6 != 9; uVar6 = uVar6 + 1) {
    if (p->nLuckySizes[uVar6] != 0) {
      printf("%d=%d  ",uVar6 & 0xffffffff);
    }
  }
  printf("  ");
  printf("Gate sizes:  ");
  for (uVar5 = 0; uVar5 != 9; uVar5 = uVar5 + 1) {
    if (p->nLuckyGates[uVar5] != 0) {
      printf("%d=%d  ",uVar5 & 0xffffffff);
    }
  }
  putchar(10);
  printf("Reduction:   ");
  iVar4 = p->nTotalNodesBeg;
  iVar1 = 1;
  if (1 < iVar4) {
    iVar1 = iVar4;
  }
  printf("Nodes  %6d out of %6d (%6.2f %%)   ",
         ((double)(iVar4 - p->nTotalNodesEnd) * 100.0) / (double)iVar1);
  iVar4 = p->nTotalEdgesBeg;
  iVar1 = 1;
  if (1 < iVar4) {
    iVar1 = iVar4;
  }
  printf("Edges  %6d out of %6d (%6.2f %%)   ",
         ((double)(iVar4 - p->nTotalEdgesEnd) * 100.0) / (double)iVar1);
  putchar(10);
  return;
}

Assistant:

void Sfm_DecPrintStats( Sfm_Dec_t * p )
{
    int i;
    printf( "Node = %d. Try = %d. Change = %d.   Const0 = %d. Const1 = %d. Buf = %d. Inv = %d. Gate = %d. AndOr = %d. Effort = %d.  NoDec = %d.\n",
        p->nTotalNodesBeg, p->nNodesTried, p->nNodesChanged, p->nNodesConst0, p->nNodesConst1, p->nNodesBuf, p->nNodesInv, p->nNodesResyn, p->nNodesAndOr, p->nEfforts, p->nNoDecs );
    printf( "MaxDiv = %d. MaxWin = %d.   AveDiv = %d. AveWin = %d.   Calls = %d. (Sat = %d. Unsat = %d.)  Over = %d.  T/O = %d.\n",
        p->nMaxDivs, p->nMaxWin, (int)(p->nAllDivs/Abc_MaxInt(1, p->nNodesTried)), (int)(p->nAllWin/Abc_MaxInt(1, p->nNodesTried)), p->nSatCalls, p->nSatCallsSat, p->nSatCallsUnsat, p->nSatCallsOver, p->nTimeOuts );

    p->timeTotal = Abc_Clock() - p->timeStart;
    p->timeOther = p->timeTotal - p->timeLib - p->timeWin - p->timeCnf - p->timeSat - p->timeTime;

    ABC_PRTP( "Lib   ", p->timeLib  ,           p->timeTotal );
    ABC_PRTP( "Win   ", p->timeWin  ,           p->timeTotal );
    ABC_PRTP( "Cnf   ", p->timeCnf  ,           p->timeTotal );
    ABC_PRTP( "Sat   ", p->timeSat-p->timeEval, p->timeTotal );
    ABC_PRTP( " Sat  ", p->timeSatSat,          p->timeTotal );
    ABC_PRTP( " Unsat", p->timeSatUnsat,        p->timeTotal );
    ABC_PRTP( "Eval  ", p->timeEval ,           p->timeTotal );
    ABC_PRTP( "Timing", p->timeTime ,           p->timeTotal );
    ABC_PRTP( "Other ", p->timeOther,           p->timeTotal );
    ABC_PRTP( "ALL   ", p->timeTotal,           p->timeTotal );

    printf( "Cone sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckySizes[i] )
            printf( "%d=%d  ", i, p->nLuckySizes[i] );
    printf( "  " );

    printf( "Gate sizes:  " );
    for ( i = 0; i <= SFM_SUPP_MAX; i++ )
        if ( p->nLuckyGates[i] )
            printf( "%d=%d  ", i, p->nLuckyGates[i] );
    printf( "\n" );

    printf( "Reduction:   " );
    printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
    printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
    printf( "\n" );
}